

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyLink.h
# Opt level: O2

void __thiscall btMultibodyLink::updateCacheMultiDof(btMultibodyLink *this,btScalar *pq)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  btScalar *s;
  float fVar3;
  float fVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar5;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  btVector3 bVar6;
  btQuaternion bVar7;
  btQuadWord local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [12];
  float fStack_4c;
  btScalar local_44;
  btVector3 local_40;
  
  s = this->m_jointPos;
  if (pq != (btScalar *)0x0) {
    s = pq;
  }
  switch(this->m_jointType) {
  case eRevolute:
    local_40.m_floats[0] = -*s;
    btQuaternion::setRotation((btQuaternion *)&local_78,&this->m_axes[0].m_topVec,local_40.m_floats)
    ;
    bVar7 = operator*((btQuaternion *)&local_78,&this->m_zeroRotParentToThis);
    *(btQuadWord *)(this->m_cachedRotParentToThis).super_btQuadWord.m_floats =
         bVar7.super_btQuadWord.m_floats;
    local_78.m_floats = (btScalar  [4])quatRotate(&this->m_cachedRotParentToThis,&this->m_eVector);
    break;
  case ePrismatic:
    local_78.m_floats = (btScalar  [4])quatRotate(&this->m_cachedRotParentToThis,&this->m_eVector);
    bVar6 = operator+(&this->m_dVector,(btVector3 *)&local_78);
    local_68._8_4_ = extraout_XMM0_Dc_01;
    local_68._0_8_ = bVar6.m_floats._0_8_;
    local_68._12_4_ = extraout_XMM0_Dd_01;
    local_58._8_4_ = in_XMM1_Dc;
    local_58._0_8_ = bVar6.m_floats._8_8_;
    fStack_4c = in_XMM1_Dd;
    bVar6 = operator*(&this->m_axes[0].m_bottomVec,s);
    fVar5 = bVar6.m_floats[2];
    fVar3 = bVar6.m_floats[0];
    fVar4 = bVar6.m_floats[1];
    goto LAB_0018bc57;
  case eSpherical:
    local_78.m_floats[3] = -s[3];
    local_78.m_floats._0_12_ = *(undefined1 (*) [12])s;
    bVar7 = operator*((btQuaternion *)&local_78,&this->m_zeroRotParentToThis);
    *(btQuadWord *)(this->m_cachedRotParentToThis).super_btQuadWord.m_floats =
         bVar7.super_btQuadWord.m_floats;
    local_78.m_floats = (btScalar  [4])quatRotate(&this->m_cachedRotParentToThis,&this->m_eVector);
    break;
  case ePlanar:
    local_40.m_floats[0] = -*s;
    btQuaternion::setRotation((btQuaternion *)&local_78,&this->m_axes[0].m_topVec,local_40.m_floats)
    ;
    bVar7 = operator*((btQuaternion *)&local_78,&this->m_zeroRotParentToThis);
    *(btQuadWord *)(this->m_cachedRotParentToThis).super_btQuadWord.m_floats =
         bVar7.super_btQuadWord.m_floats;
    local_44 = -*s;
    btQuaternion::setRotation((btQuaternion *)&local_78,&this->m_axes[0].m_topVec,&local_44);
    bVar6 = operator*(&this->m_axes[1].m_bottomVec,s + 1);
    local_68._8_4_ = extraout_XMM0_Dc;
    local_68._0_8_ = bVar6.m_floats._0_8_;
    local_68._12_4_ = extraout_XMM0_Dd;
    local_58._8_4_ = in_XMM1_Dc;
    local_58._0_8_ = bVar6.m_floats._8_8_;
    fStack_4c = in_XMM1_Dd;
    bVar6 = operator*(&this->m_axes[2].m_bottomVec,s + 2);
    in_XMM1_Dc = in_XMM1_Dc + (float)local_58._8_4_;
    in_XMM1_Dd = in_XMM1_Dd + fStack_4c;
    local_40.m_floats[1] = bVar6.m_floats[1] + (float)local_68._4_4_;
    local_40.m_floats[0] = bVar6.m_floats[0] + (float)local_68._0_4_;
    local_40.m_floats[2] = bVar6.m_floats[2] + (float)local_58._0_4_;
    local_40.m_floats[3] = 0.0;
    bVar6 = quatRotate((btQuaternion *)&local_78,&local_40);
    local_68._8_4_ = extraout_XMM0_Dc_00;
    local_68._0_8_ = bVar6.m_floats._0_8_;
    local_68._12_4_ = extraout_XMM0_Dd_00;
    local_58._8_4_ = in_XMM1_Dc;
    local_58._0_8_ = bVar6.m_floats._8_8_;
    fStack_4c = in_XMM1_Dd;
    bVar6 = quatRotate(&this->m_cachedRotParentToThis,&this->m_eVector);
    fVar5 = bVar6.m_floats[2];
    fVar3 = bVar6.m_floats[0];
    fVar4 = bVar6.m_floats[1];
LAB_0018bc57:
    auVar1._4_4_ = fVar4 + (float)local_68._4_4_;
    auVar1._0_4_ = fVar3 + (float)local_68._0_4_;
    auVar1._8_4_ = fVar5 + (float)local_58._0_4_;
    auVar1._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedRVector).m_floats = auVar1;
    return;
  case eFixed:
    uVar2 = *(undefined8 *)((this->m_zeroRotParentToThis).super_btQuadWord.m_floats + 2);
    *(undefined8 *)(this->m_cachedRotParentToThis).super_btQuadWord.m_floats =
         *(undefined8 *)(this->m_zeroRotParentToThis).super_btQuadWord.m_floats;
    *(undefined8 *)((this->m_cachedRotParentToThis).super_btQuadWord.m_floats + 2) = uVar2;
    local_78.m_floats = (btScalar  [4])quatRotate(&this->m_cachedRotParentToThis,&this->m_eVector);
    break;
  default:
    goto switchD_0018ba3b_default;
  }
  bVar6 = operator+(&this->m_dVector,(btVector3 *)&local_78);
  *&(this->m_cachedRVector).m_floats = bVar6.m_floats;
switchD_0018ba3b_default:
  return;
}

Assistant:

void updateCacheMultiDof(btScalar *pq = 0)
	{
		btScalar *pJointPos = (pq ? pq : &m_jointPos[0]);

		switch(m_jointType)
		{
			case eRevolute:
			{
				m_cachedRotParentToThis = btQuaternion(getAxisTop(0),-pJointPos[0]) * m_zeroRotParentToThis;
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector);

				break;
			}
			case ePrismatic:
			{
				// m_cachedRotParentToThis never changes, so no need to update
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector) + pJointPos[0] * getAxisBottom(0);

				break;
			}
			case eSpherical:
			{
				m_cachedRotParentToThis = btQuaternion(pJointPos[0], pJointPos[1], pJointPos[2], -pJointPos[3]) * m_zeroRotParentToThis;
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector);

				break;
			}
			case ePlanar:
			{
				m_cachedRotParentToThis = btQuaternion(getAxisTop(0),-pJointPos[0]) * m_zeroRotParentToThis;				
				m_cachedRVector = quatRotate(btQuaternion(getAxisTop(0),-pJointPos[0]), pJointPos[1] * getAxisBottom(1) + pJointPos[2] * getAxisBottom(2)) + quatRotate(m_cachedRotParentToThis,m_eVector);				

				break;
			}
			case eFixed:
			{
				m_cachedRotParentToThis = m_zeroRotParentToThis;
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector);

				break;
			}
			default:
			{
				//invalid type
				btAssert(0);
			}
		}
	}